

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

bool google::protobuf::io::Printer::Validate
               (bool cond,PrintOptions opts,
               FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               message)

{
  LogMessage *pLVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  LogMessage local_98;
  Voidify local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  LogMessage local_50;
  Voidify local_3a;
  byte local_39;
  VoidPtr VStack_38;
  bool cond_local;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message_local;
  PrintOptions opts_local;
  
  register0x00000030 = opts._0_8_;
  message_local.ptr_ = (VoidPtr)message.invoker_;
  VStack_38 = message.ptr_;
  local_39 = cond;
  if (!cond) {
    if (((unkuint9)opts & 0x10000) == 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
                 ,0x141);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_98);
      absl::lts_20250127::
      FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
      ::operator()(&local_b8,
                   (FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                    *)&stack0xffffffffffffffc8);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,&local_b8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_81,pLVar1);
      std::__cxx11::string::~string((string *)&local_b8);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_98);
    }
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
               ,0x13f);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::
    FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
    ::operator()(&local_80,
                 (FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                  *)&stack0xffffffffffffffc8);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,&local_80);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_3a,pLVar1);
    std::__cxx11::string::~string((string *)&local_80);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_50);
  }
  return (bool)(local_39 & 1);
}

Assistant:

bool Printer::Validate(bool cond, Printer::PrintOptions opts,
                       absl::FunctionRef<std::string()> message) {
  if (!cond) {
    if (opts.checks_are_debug_only) {
      ABSL_DLOG(FATAL) << message();
    } else {
      ABSL_LOG(FATAL) << message();
    }
  }
  return cond;
}